

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaf2c.c
# Opt level: O1

void ga_f2c_get_cmd_args(int *argc,char ***argv)

{
  int iVar1;
  undefined8 uVar2;
  char **ppcVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  char cstring [255];
  char fstring [255];
  long local_258;
  undefined8 local_250;
  int *local_248;
  char ***local_240;
  char local_238 [255];
  char acStack_139 [265];
  
  local_258 = 0;
  local_248 = argc;
  local_240 = argv;
  uVar2 = f2c_iargc_();
  if (0xff < (int)uVar2) {
    printf("ga_f2c_get_cmd_args: too many cmd line args");
    armci_msg_abort(1);
  }
  ppcVar3 = (char **)malloc(0x7f8);
  if (ppcVar3 == (char **)0x0) {
    printf("ga_f2c_get_cmd_args: malloc iargv failed");
    armci_msg_abort(1);
  }
  lVar7 = (long)(int)uVar2;
  local_258 = 0;
  local_250 = uVar2;
  if (0 < lVar7) {
    do {
      f2c_getarg_(&local_258,acStack_139 + 1,0xff);
      iVar1 = 0x100;
      lVar6 = 0xff;
      do {
        if (lVar6 == 0) {
          iVar1 = 0;
          break;
        }
        iVar1 = iVar1 + -1;
        pcVar4 = acStack_139 + lVar6;
        lVar6 = lVar6 + -1;
      } while (*pcVar4 == ' ');
      iVar5 = 0xfe;
      if (iVar1 < 0xfe) {
        iVar5 = iVar1;
      }
      local_238[iVar5] = '\0';
      if (iVar1 != 0) {
        memcpy(local_238,acStack_139 + 1,(long)iVar5);
      }
      pcVar4 = strdup(local_238);
      ppcVar3[local_258] = pcVar4;
      local_258 = local_258 + 1;
    } while (local_258 < lVar7);
  }
  *local_248 = (int)local_250;
  *local_240 = ppcVar3;
  ppcVar3[lVar7] = (char *)0x0;
  return;
}

Assistant:

void ga_f2c_get_cmd_args(int *argc, char ***argv)
{
    Integer i=0;
    int iargc=F2C_IARGC();
    char **iargv=NULL;

    if (iargc > F2C_GETARG_ARGV_MAX) {
        printf("ga_f2c_get_cmd_args: too many cmd line args");
        armci_msg_abort(1);
    }
    iargv = (char**)malloc(sizeof(char*)*F2C_GETARG_ARGV_MAX);
    if (!iargv) {
        printf("ga_f2c_get_cmd_args: malloc iargv failed");
        armci_msg_abort(1);
    }
    for (i=0; i<iargc; i++) {
        char fstring[F2C_GETARG_ARGLEN_MAX];
        char cstring[F2C_GETARG_ARGLEN_MAX];
        F2C_GETARG(&i, fstring, F2C_GETARG_ARGLEN_MAX);
        ga_f2cstring(fstring, F2C_GETARG_ARGLEN_MAX,
                cstring, F2C_GETARG_ARGLEN_MAX);
        iargv[i] = strdup(cstring);
    }
    *argc = iargc;
    *argv = iargv;
    iargv[iargc] = 0;
}